

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc-test.c++:67:43)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_websocket_rpc_test_c__:67:43)>
          *this,ExceptionOrValue *output)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_3b0;
  Fault local_3a8;
  NullableValue<capnp::MessageReaderAndFds> local_3a0;
  ExceptionOr<kj::Promise<void>_> local_378;
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> depResult;
  
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&depResult.super_ExceptionOrValue);
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_378,
               &depResult.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_378.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_378)
    ;
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_378);
  }
  else if (depResult.value.ptr.isSet == true) {
    Maybe<capnp::MessageReaderAndFds>::Maybe
              ((Maybe<capnp::MessageReaderAndFds> *)&local_3a0,&depResult.value.ptr.field_1.value);
    if (local_3a0.isSet == true) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55]>
                (&local_3a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc-test.c++"
                 ,0x45,FAILED,(char *)0x0,
                 "\"Should have gotten kj::none after websocket was closed\"",
                 (char (*) [55])"Should have gotten kj::none after websocket was closed");
      Debug::Fault::fatal(&local_3a8);
    }
    ReadyNow::operator_cast_to_Promise((ReadyNow *)&local_3b0.value);
    NullableValue<capnp::MessageReaderAndFds>::~NullableValue(&local_3a0);
    local_378.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_378.value.ptr.isSet = true;
    local_378.value.ptr.field_1 = local_3b0;
    local_3b0 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_378)
    ;
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_378);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_3b0.value);
  }
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::~ExceptionOr(&depResult);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }